

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

word Npn_TruthPadWord(word uTruth,int nVars)

{
  word wStack_18;
  int nVars_local;
  word uTruth_local;
  
  uTruth_local = uTruth;
  if (nVars != 6) {
    wStack_18 = uTruth;
    if (nVars < 6) {
      wStack_18 = uTruth << 0x20 | uTruth & 0xffffffff;
    }
    if (nVars < 5) {
      wStack_18 = (wStack_18 & 0xffff0000ffff) << 0x10 | wStack_18 & 0xffff0000ffff;
    }
    if (nVars < 4) {
      wStack_18 = (wStack_18 & 0xff00ff00ff00ff) << 8 | wStack_18 & 0xff00ff00ff00ff;
    }
    if (nVars < 3) {
      wStack_18 = (wStack_18 & 0xf0f0f0f0f0f0f0f) << 4 | wStack_18 & 0xf0f0f0f0f0f0f0f;
    }
    if (nVars < 2) {
      wStack_18 = (wStack_18 & 0x3333333333333333) << 2 | wStack_18 & 0x3333333333333333;
    }
    if (nVars == 0) {
      wStack_18 = (wStack_18 & 0x5555555555555555) << 1 | wStack_18 & 0x5555555555555555;
    }
    uTruth_local = wStack_18;
  }
  return uTruth_local;
}

Assistant:

word Npn_TruthPadWord( word uTruth, int nVars )
{
    if ( nVars == 6 )
        return uTruth;
    if ( nVars <= 5 )
        uTruth = ((uTruth & ABC_CONST(0x00000000FFFFFFFF)) << 32) | (uTruth & ABC_CONST(0x00000000FFFFFFFF));
    if ( nVars <= 4 )
        uTruth = ((uTruth & ABC_CONST(0x0000FFFF0000FFFF)) << 16) | (uTruth & ABC_CONST(0x0000FFFF0000FFFF));
    if ( nVars <= 3 )
        uTruth = ((uTruth & ABC_CONST(0x00FF00FF00FF00FF)) <<  8) | (uTruth & ABC_CONST(0x00FF00FF00FF00FF));
    if ( nVars <= 2 )
        uTruth = ((uTruth & ABC_CONST(0x0F0F0F0F0F0F0F0F)) <<  4) | (uTruth & ABC_CONST(0x0F0F0F0F0F0F0F0F));
    if ( nVars <= 1 )
        uTruth = ((uTruth & ABC_CONST(0x3333333333333333)) <<  2) | (uTruth & ABC_CONST(0x3333333333333333));
    if ( nVars == 0 )
        uTruth = ((uTruth & ABC_CONST(0x5555555555555555)) <<  1) | (uTruth & ABC_CONST(0x5555555555555555));
    return uTruth;
}